

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O3

int secp256r1_create_key_exchange
              (ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx)

{
  int iVar1;
  ptls_key_exchange_context_t *ppVar2;
  uECC_Curve curve;
  
  ppVar2 = (ptls_key_exchange_context_t *)malloc(0x88);
  if (ppVar2 == (ptls_key_exchange_context_t *)0x0) {
    iVar1 = 0x201;
  }
  else {
    ppVar2->algo = algo;
    (ppVar2->pubkey).base = (uint8_t *)(ppVar2 + 2);
    (ppVar2->pubkey).len = 0x41;
    ppVar2->on_exchange = secp256r1_on_exchange;
    *(undefined1 *)&ppVar2[2].algo = 4;
    curve = uECC_secp256r1();
    uECC_make_key((uint8_t *)((long)&ppVar2[2].algo + 1),(uint8_t *)(ppVar2 + 1),curve);
    *_ctx = ppVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int secp256r1_create_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx)
{
    struct st_secp256r1_key_exhchange_t *ctx;

    if ((ctx = (struct st_secp256r1_key_exhchange_t *)malloc(sizeof(*ctx))) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ctx->super = (ptls_key_exchange_context_t){algo, ptls_iovec_init(ctx->pub, sizeof(ctx->pub)), secp256r1_on_exchange};
    ctx->pub[0] = TYPE_UNCOMPRESSED_PUBLIC_KEY;
    uECC_make_key(ctx->pub + 1, ctx->priv, uECC_secp256r1());

    *_ctx = &ctx->super;
    return 0;
}